

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

uint Imf_3_4::halfToUint(half h)

{
  bool bVar1;
  uint uVar2;
  float fVar3;
  undefined2 unaff_retaddr;
  undefined4 unaff_retaddr_00;
  half local_6;
  uint local_4;
  
  bVar1 = Imath_3_2::half::isNegative(&local_6);
  if ((!bVar1) &&
     (bVar1 = Imath_3_2::half::isNan
                        ((half *)CONCAT44(unaff_retaddr_00,CONCAT22(h._h,unaff_retaddr))), !bVar1))
  {
    bVar1 = Imath_3_2::half::isInfinity
                      ((half *)CONCAT44(unaff_retaddr_00,CONCAT22(h._h,unaff_retaddr)));
    if (!bVar1) {
      fVar3 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT44(unaff_retaddr_00,CONCAT22(h._h,unaff_retaddr)));
      local_4 = (uint)(long)fVar3;
      return local_4;
    }
    uVar2 = std::numeric_limits<unsigned_int>::max();
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned int
halfToUint (half h)
{
    if (h.isNegative () || h.isNan ()) return 0;

    if (h.isInfinity ()) return std::numeric_limits<unsigned int>::max ();

    return static_cast<unsigned int> (h);
}